

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

Gia_Man_t * Jf_ManDeriveMappingGia(Jf_Man_t *p)

{
  long lVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  char *pcVar6;
  int *piVar7;
  Cnf_Dat_t *pCVar8;
  bool bVar9;
  word **local_80;
  word *pTruth;
  word uTruth;
  int *pCut;
  int Class;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vClas;
  Vec_Int_t *vLits;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vCover;
  Vec_Int_t *vMapping2;
  Vec_Int_t *vMapping;
  Vec_Int_t *vCopies;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Jf_Man_t *p_local;
  
  pNew = (Gia_Man_t *)p;
  iVar3 = Gia_ManObjNum(p->pGia);
  vMapping = Vec_IntStartFull(iVar3);
  iVar3 = Gia_ManObjNum((Gia_Man_t *)pNew->pName);
  vMapping2 = Vec_IntStart(iVar3 * 2 + (int)*(undefined8 *)(pNew->pSpec + 0xb0) +
                           (int)*(undefined8 *)(pNew->pSpec + 0xa8) * 2);
  vCover = Vec_IntStart((int)*(undefined8 *)(pNew->pSpec + 0xb0) +
                        (int)*(undefined8 *)(pNew->pSpec + 0xa8) * 2 + 1000);
  vLeaves = Vec_IntAlloc(0x10000);
  vLits = Vec_IntAlloc(0x10);
  vClas = (Vec_Int_t *)0x0;
  _k = (Vec_Int_t *)0x0;
  pTruth = (word *)0x0;
  local_80 = &pTruth;
  if (*(int *)(pNew->pSpec + 0x58) == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x5a3,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
  }
  if (*(int *)(pNew->pSpec + 0x60) != 0) {
    vClas = Vec_IntAlloc(1000);
    pVVar5 = Vec_IntAlloc(1000);
    _k = pVVar5;
    iVar3 = Vec_IntSize(vClas);
    Vec_IntPush(pVVar5,iVar3);
    Vec_IntPush(vClas,1);
  }
  iVar3 = Gia_ManObjNum((Gia_Man_t *)pNew->pName);
  pObj = (Gia_Obj_t *)Gia_ManStart(iVar3);
  pcVar6 = Abc_UtilStrsav(*(char **)pNew->pName);
  *(char **)pObj = pcVar6;
  pcVar6 = Abc_UtilStrsav(*(char **)(pNew->pName + 8));
  *(char **)&pObj->Value = pcVar6;
  Vec_IntWriteEntry(vMapping,0,0);
  iLit = 0;
  while( true ) {
    iVar3 = iLit;
    iVar4 = Vec_IntSize(*(Vec_Int_t **)(pNew->pName + 0x40));
    bVar9 = false;
    if (iVar3 < iVar4) {
      vCopies = (Vec_Int_t *)Gia_ManCi((Gia_Man_t *)pNew->pName,iLit);
      bVar9 = vCopies != (Vec_Int_t *)0x0;
    }
    pVVar5 = vMapping;
    if (!bVar9) break;
    iVar3 = Gia_ObjId((Gia_Man_t *)pNew->pName,(Gia_Obj_t *)vCopies);
    iVar4 = Gia_ManAppendCi((Gia_Man_t *)pObj);
    Vec_IntWriteEntry(pVVar5,iVar3,iVar4);
    iLit = iLit + 1;
  }
  iLit = 0;
  while( true ) {
    bVar9 = false;
    if (iLit < *(int *)(pNew->pName + 0x18)) {
      vCopies = (Vec_Int_t *)Gia_ManObj((Gia_Man_t *)pNew->pName,iLit);
      bVar9 = vCopies != (Vec_Int_t *)0x0;
    }
    if (!bVar9) break;
    iVar3 = Gia_ObjIsAnd((Gia_Obj_t *)vCopies);
    if (((iVar3 != 0) && (iVar3 = Gia_ObjIsBuf((Gia_Obj_t *)vCopies), iVar3 == 0)) &&
       (iVar3 = Gia_ObjRefNum((Gia_Man_t *)pNew->pName,(Gia_Obj_t *)vCopies), iVar3 != 0)) {
      uTruth = (word)Jf_ObjCutBest((Jf_Man_t *)pNew,iLit);
      pCut._0_4_ = Jf_CutFuncClass((int *)uTruth);
      iVar4 = Jf_CutSize((int *)uTruth);
      pVVar5 = vMapping;
      iVar3 = iLit;
      if (iVar4 == 0) {
        if ((int)pCut != 0) {
          __assert_fail("Class == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                        ,0x5bd,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
        }
        iVar4 = Jf_CutFunc((int *)uTruth);
        Vec_IntWriteEntry(pVVar5,iVar3,iVar4);
      }
      else {
        iVar3 = Jf_CutSize((int *)uTruth);
        if (iVar3 == 1) {
          if ((int)pCut != 1) {
            __assert_fail("Class == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                          ,0x5c3,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
          }
          iVar3 = Jf_CutLit((int *)uTruth,1);
          iVar4 = Jf_CutFuncCompl((int *)uTruth);
          pCut._4_4_ = Abc_LitNotCond(iVar3,iVar4);
          piVar7 = Vec_IntArray(vMapping);
          pCut._4_4_ = Abc_Lit2LitL(piVar7,pCut._4_4_);
          Vec_IntWriteEntry(vMapping,iLit,pCut._4_4_);
        }
        else {
          if (*(int *)(pNew->pSpec + 0x5c) == 0) {
            local_80 = (word **)Vec_MemReadEntry((Vec_Mem_t *)pNew->pObjs,(int)pCut);
          }
          else {
            pTruth = (word *)Sdm_ManReadDsdTruth(*(Sdm_Man_t **)&pNew->nRegs,(int)pCut);
          }
          lVar1._0_4_ = pNew->nRegs;
          lVar1._4_4_ = pNew->nRegsAlloc;
          if (lVar1 != 0) {
            iVar3 = Sdm_ManReadDsdVarNum(*(Sdm_Man_t **)&pNew->nRegs,(int)pCut);
            iVar4 = Jf_CutSize((int *)uTruth);
            if (iVar3 != iVar4) {
              __assert_fail("p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                            ,0x5cd,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
            }
          }
          Vec_IntClear(vLits);
          Class = 1;
          while( true ) {
            iVar3 = Class;
            iVar4 = Jf_CutSize((int *)uTruth);
            bVar9 = false;
            if (iVar3 <= iVar4) {
              pCut._4_4_ = Jf_CutLit((int *)uTruth,Class);
              bVar9 = pCut._4_4_ != 0;
            }
            pGVar2 = pObj;
            pVVar5 = vLits;
            if (!bVar9) break;
            piVar7 = Vec_IntArray(vMapping);
            iVar3 = Abc_Lit2LitL(piVar7,pCut._4_4_);
            Vec_IntPush(pVVar5,iVar3);
            Class = Class + 1;
          }
          iVar3 = Vec_IntSize(vLits);
          pCut._4_4_ = Kit_TruthToGia((Gia_Man_t *)pGVar2,(uint *)local_80,iVar3,vLeaves,vLits,0);
          if (*(int *)(pNew->pSpec + 0x60) != 0) {
            Jf_ManGenCnf((word)pTruth,pCut._4_4_,vLits,vClas,_k,vLeaves);
          }
          iVar3 = pCut._4_4_;
          iVar4 = Jf_CutFuncCompl((int *)uTruth);
          pCut._4_4_ = Abc_LitNotCond(iVar3,iVar4);
          Vec_IntWriteEntry(vMapping,iLit,pCut._4_4_);
          pVVar5 = vMapping2;
          iVar3 = Abc_Lit2Var(pCut._4_4_);
          iVar4 = Vec_IntSize(vCover);
          Vec_IntSetEntry(pVVar5,iVar3,iVar4);
          pVVar5 = vCover;
          iVar3 = Vec_IntSize(vLits);
          Vec_IntPush(pVVar5,iVar3);
          for (Class = 0; iVar3 = Class, iVar4 = Vec_IntSize(vLits), pVVar5 = vCover, iVar3 < iVar4;
              Class = Class + 1) {
            pCut._4_4_ = Vec_IntEntry(vLits,Class);
            pVVar5 = vCover;
            iVar3 = Abc_Lit2Var(pCut._4_4_);
            Vec_IntPush(pVVar5,iVar3);
          }
          iVar3 = Vec_IntEntry(vMapping,iLit);
          iVar3 = Abc_Lit2Var(iVar3);
          Vec_IntPush(pVVar5,iVar3);
        }
      }
    }
    iLit = iLit + 1;
  }
  iLit = 0;
  while( true ) {
    iVar3 = iLit;
    iVar4 = Vec_IntSize(*(Vec_Int_t **)(pNew->pName + 0x48));
    bVar9 = false;
    if (iVar3 < iVar4) {
      vCopies = (Vec_Int_t *)Gia_ManCo((Gia_Man_t *)pNew->pName,iLit);
      bVar9 = vCopies != (Vec_Int_t *)0x0;
    }
    if (!bVar9) break;
    if (*(int *)(pNew->pSpec + 0x60) != 0) {
      Vec_IntClear(vLits);
    }
    pVVar5 = vMapping;
    iVar3 = Gia_ObjFaninId0p((Gia_Man_t *)pNew->pName,(Gia_Obj_t *)vCopies);
    iVar3 = Vec_IntEntry(pVVar5,iVar3);
    pVVar5 = vLits;
    pCut._4_4_ = iVar3;
    if (*(int *)(pNew->pSpec + 0x60) != 0) {
      iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)vCopies);
      iVar3 = Abc_LitNotCond(iVar3,iVar4);
      Vec_IntPush(pVVar5,iVar3);
    }
    pGVar2 = pObj;
    iVar3 = pCut._4_4_;
    iVar4 = Gia_ObjFaninC0((Gia_Obj_t *)vCopies);
    iVar3 = Abc_LitNotCond(iVar3,iVar4);
    pCut._4_4_ = Gia_ManAppendCo((Gia_Man_t *)pGVar2,iVar3);
    if (*(int *)(pNew->pSpec + 0x60) != 0) {
      Jf_ManGenCnf(0xaaaaaaaaaaaaaaaa,pCut._4_4_,vLits,vClas,_k,vLeaves);
    }
    iLit = iLit + 1;
  }
  Vec_IntFree(vMapping);
  Vec_IntFree(vLeaves);
  Vec_IntFree(vLits);
  iVar3 = Vec_IntSize(vMapping2);
  iVar4 = Gia_ManObjNum((Gia_Man_t *)pObj);
  pVVar5 = vMapping2;
  if (iVar4 < iVar3) {
    iVar3 = Gia_ManObjNum((Gia_Man_t *)pObj);
    Vec_IntShrink(pVVar5,iVar3);
  }
  else {
    iVar3 = Gia_ManObjNum((Gia_Man_t *)pObj);
    Vec_IntFillExtra(pVVar5,iVar3,0);
  }
  iVar3 = Vec_IntSize(vMapping2);
  iVar4 = Gia_ManObjNum((Gia_Man_t *)pObj);
  if (iVar3 == iVar4) {
    for (iLit = 0; iVar3 = iLit, iVar4 = Vec_IntSize(vMapping2), iVar3 < iVar4; iLit = iLit + 1) {
      pCut._4_4_ = Vec_IntEntry(vMapping2,iLit);
      pVVar5 = vMapping2;
      iVar3 = iLit;
      if (0 < pCut._4_4_) {
        iVar4 = Gia_ManObjNum((Gia_Man_t *)pObj);
        Vec_IntAddToEntry(pVVar5,iVar3,iVar4);
      }
    }
    Vec_IntAppend(vMapping2,vCover);
    Vec_IntFree(vCover);
    pGVar2 = pObj;
    if (*(long *)(pObj + 0x16) == 0) {
      *(Vec_Int_t **)(pObj + 0x16) = vMapping2;
      iVar3 = Gia_ManRegNum((Gia_Man_t *)pNew->pName);
      Gia_ManSetRegNum((Gia_Man_t *)pGVar2,iVar3);
      if (*(int *)(pNew->pSpec + 0x60) != 0) {
        if (*(int *)(pNew->pSpec + 100) == 0) {
          pCVar8 = Jf_ManCreateCnfRemap((Gia_Man_t *)pObj,vClas,_k,*(int *)(pNew->pSpec + 0x68));
          *(Cnf_Dat_t **)&pObj[0x3e].Value = pCVar8;
        }
        else {
          pCVar8 = Jf_ManCreateCnf((Gia_Man_t *)pObj,vClas,_k);
          *(Cnf_Dat_t **)&pObj[0x3e].Value = pCVar8;
        }
      }
      Vec_IntFreeP(&vClas);
      Vec_IntFreeP((Vec_Int_t **)&k);
      return (Gia_Man_t *)pObj;
    }
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x5f9,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
  }
  __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                ,0x5f2,"Gia_Man_t *Jf_ManDeriveMappingGia(Jf_Man_t *)");
}

Assistant:

Gia_Man_t * Jf_ManDeriveMappingGia( Jf_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2 * (int)p->pPars->Area );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2 * (int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    Vec_Int_t * vLits = NULL, * vClas = NULL;
    int i, k, iLit, Class, * pCut;
    word uTruth = 0, * pTruth = &uTruth;
    assert( p->pPars->fCutMin );
    if ( p->pPars->fGenCnf )
    {
        vLits = Vec_IntAlloc( 1000 );
        vClas = Vec_IntAlloc( 1000 );
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        Vec_IntPush( vLits, 1 );
    }
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntWriteEntry( vCopies, Gia_ObjId(p->pGia, pObj), Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
       if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
//        printf( "Best cut of node %d:  ", i );  Jf_CutPrint(pCut);
        Class = Jf_CutFuncClass( pCut );
        if ( Jf_CutSize(pCut) == 0 )
        {
            assert( Class == 0 );
            Vec_IntWriteEntry( vCopies, i, Jf_CutFunc(pCut) );
            continue;
        }
        if ( Jf_CutSize(pCut) == 1 )
        {
            assert( Class == 1 );
            iLit = Abc_LitNotCond( Jf_CutLit(pCut, 1) , Jf_CutFuncCompl(pCut) );
            iLit = Abc_Lit2LitL( Vec_IntArray(vCopies), iLit );
            Vec_IntWriteEntry( vCopies, i, iLit );
            continue;
        }
        if ( p->pPars->fFuncDsd )
            uTruth = Sdm_ManReadDsdTruth(p->pDsd, Class);
        else
            pTruth = Vec_MemReadEntry(p->vTtMem, Class);
        assert( p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut) );
        // collect leaves
        Vec_IntClear( vLeaves );
        Jf_CutForEachLit( pCut, iLit, k )
            Vec_IntPush( vLeaves, Abc_Lit2LitL(Vec_IntArray(vCopies), iLit) );
        // create GIA
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        if ( p->pPars->fGenCnf )
            Jf_ManGenCnf( uTruth, iLit, vLeaves, vLits, vClas, vCover );
        iLit = Abc_LitNotCond( iLit, Jf_CutFuncCompl(pCut) );
        Vec_IntWriteEntry( vCopies, i, iLit );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iLit, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLit) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(Vec_IntEntry(vCopies, i)) );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        if ( p->pPars->fGenCnf )
            Vec_IntClear( vLeaves );
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        if ( p->pPars->fGenCnf )
            Vec_IntPush( vLeaves, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
        iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
        if ( p->pPars->fGenCnf )
            Jf_ManGenCnf( ABC_CONST(0xAAAAAAAAAAAAAAAA), iLit, vLeaves, vLits, vClas, vCover );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    // derive CNF
    if ( p->pPars->fGenCnf )
    {
        if ( p->pPars->fCnfObjIds )
            pNew->pData = Jf_ManCreateCnf( pNew, vLits, vClas );
        else
            pNew->pData = Jf_ManCreateCnfRemap( pNew, vLits, vClas, p->pPars->fAddOrCla );
    }
    Vec_IntFreeP( &vLits );
    Vec_IntFreeP( &vClas );
    return pNew;
}